

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O0

int __thiscall avro::DataFileReaderBase::init(DataFileReaderBase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined7 extraout_var;
  ResolvingDecoderPtr RVar2;
  DataFileReaderBase *in_stack_00000088;
  ValidSchema *in_stack_000000e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  shared_ptr<avro::Decoder> *r;
  undefined6 in_stack_ffffffffffffff68;
  byte bVar3;
  byte bVar4;
  ValidSchema *in_stack_ffffffffffffff70;
  ValidSchema *in_stack_ffffffffffffff78;
  undefined1 local_80 [32];
  string local_60 [32];
  string local_40 [32];
  shared_ptr<avro::Decoder> local_20;
  EVP_PKEY_CTX *local_10;
  DataFileReaderBase *local_8;
  
  r = (shared_ptr<avro::Decoder> *)&this->readerSchema_;
  local_10 = ctx;
  local_8 = this;
  ValidSchema::operator=
            ((ValidSchema *)in_stack_ffffffffffffff50,(ValidSchema *)in_stack_ffffffffffffff48);
  toString_abi_cxx11_(in_stack_000000e8);
  bVar4 = 0;
  bVar3 = 0;
  toString_abi_cxx11_(in_stack_000000e8);
  bVar1 = std::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (bVar1) {
    binaryDecoder();
    bVar4 = 1;
    RVar2 = resolvingDecoder(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             (DecoderPtr *)CONCAT17(1,CONCAT16(bVar3,in_stack_ffffffffffffff68)));
    bVar3 = 1;
    boost::shared_ptr<avro::Decoder>::shared_ptr<avro::ResolvingDecoder>
              (&local_20,local_80,RVar2.pn.pi_.pi_);
  }
  else {
    binaryDecoder();
  }
  boost::shared_ptr<avro::Decoder>::operator=((shared_ptr<avro::Decoder> *)this,r);
  boost::shared_ptr<avro::Decoder>::~shared_ptr((shared_ptr<avro::Decoder> *)0x26f20e);
  if ((bVar3 & 1) != 0) {
    boost::shared_ptr<avro::ResolvingDecoder>::~shared_ptr
              ((shared_ptr<avro::ResolvingDecoder> *)0x26f221);
  }
  if ((bVar4 & 1) != 0) {
    boost::shared_ptr<avro::Decoder>::~shared_ptr((shared_ptr<avro::Decoder> *)0x26f234);
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  bVar1 = readDataBlock(in_stack_00000088);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void DataFileReaderBase::init(const ValidSchema& readerSchema)
{
    readerSchema_ = readerSchema;
    dataDecoder_  = (toString(readerSchema_) != toString(dataSchema_)) ?
        resolvingDecoder(dataSchema_, readerSchema_, binaryDecoder()) :
        binaryDecoder();
    readDataBlock();
}